

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O3

GridHandle<pbrt::NanoVDBBuffer> *
nanovdb::io::readGrid<pbrt::NanoVDBBuffer>
          (GridHandle<pbrt::NanoVDBBuffer> *__return_storage_ptr__,istream *is,string *gridName,
          NanoVDBBuffer *buffer)

{
  pointer __s2;
  size_t __n;
  size_t sVar1;
  uint8_t *puVar2;
  undefined8 *puVar3;
  int iVar4;
  byte *pbVar5;
  ssize_t sVar6;
  memory_resource *pmVar7;
  void *pvVar8;
  runtime_error *prVar9;
  byte bVar10;
  vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_> *__nbytes;
  string *extraout_RDX;
  _Ios_Seekdir _Var11;
  ulong uVar13;
  string *__buf;
  string *psVar14;
  undefined8 *puVar15;
  fileSize_t size;
  uLongf numBytes;
  ulong local_90;
  NanoVDBBuffer *local_88;
  string *local_80;
  size_t local_78;
  Segment local_70;
  NanoVDBBuffer local_48;
  long lVar12;
  
  pbVar5 = (byte *)(gridName->_M_dataplus)._M_p;
  if ((pbVar5 == (byte *)0x0) || (bVar10 = *pbVar5, bVar10 == 0)) {
    __buf = gridName;
    psVar14 = (string *)0x0;
  }
  else {
    __buf = (string *)0x0;
    do {
      pbVar5 = pbVar5 + 1;
      uVar13 = (ulong)bVar10;
      bVar10 = *pbVar5;
      __buf = (string *)(uVar13 + ((ulong)__buf >> 0x38) + (long)__buf * 0x43);
      psVar14 = __buf;
    } while (bVar10 != 0);
  }
  __nbytes = &local_70.meta;
  local_70.header.magic = 0x304244566f6e614e;
  local_70.header.major = 0x13;
  local_70.header.minor = 0;
  local_70.header.gridCount = 0;
  local_70.header.codec = NONE;
  local_70.meta.
  super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>._M_impl.
  super__Vector_impl_data._M_start._0_2_ = 0;
  local_70.meta.
  super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>._M_impl.
  super__Vector_impl_data._M_start._2_6_ = 0;
  local_70.meta.
  super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>._M_impl.
  super__Vector_impl_data._M_finish._0_2_ = 0;
  local_70.meta.
  super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>._M_impl.
  super__Vector_impl_data._M_finish._2_6_ = 0;
  local_70.meta.
  super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = buffer;
  local_80 = gridName;
  do {
    sVar6 = Segment::read(&local_70,(int)is,__buf,(size_t)__nbytes);
    if ((char)sVar6 == '\0') {
      (__return_storage_ptr__->mBuffer).alloc.memoryResource = (memory_resource *)0x0;
      (__return_storage_ptr__->mBuffer).bytesAllocated = 0;
      (__return_storage_ptr__->mBuffer).ptr = (uint8_t *)0x0;
      (__return_storage_ptr__->super_GridHandleBase)._vptr_GridHandleBase =
           (_func_int **)&PTR__GridHandle_0303bc58;
      pmVar7 = pstd::pmr::new_delete_resource();
      (__return_storage_ptr__->mBuffer).alloc.memoryResource = pmVar7;
      (__return_storage_ptr__->mBuffer).bytesAllocated = 0;
      (__return_storage_ptr__->mBuffer).ptr = (uint8_t *)0x0;
LAB_0039e732:
      std::vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>::~vector
                (&local_70.meta);
      return __return_storage_ptr__;
    }
    puVar15 = (undefined8 *)
              CONCAT62(local_70.meta.
                       super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>
                       ._M_impl.super__Vector_impl_data._M_start._2_6_,
                       local_70.meta.
                       super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_2_);
    puVar3 = (undefined8 *)
             CONCAT62(local_70.meta.
                      super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>
                      ._M_impl.super__Vector_impl_data._M_finish._2_6_,
                      local_70.meta.
                      super__Vector_base<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>
                      ._M_impl.super__Vector_impl_data._M_finish._0_2_);
    if (puVar15 == puVar3) {
      _Var11 = _S_beg;
    }
    else {
      lVar12 = 0;
      __s2 = (local_80->_M_dataplus)._M_p;
      __n = local_80->_M_string_length;
      do {
        if ((((string *)puVar15[2] == psVar14) && (puVar15[0x13] == __n)) &&
           ((__n == 0 || (iVar4 = bcmp((void *)puVar15[0x12],__s2,__n), iVar4 == 0)))) {
          local_48.alloc.memoryResource = (local_88->alloc).memoryResource;
          local_48.bytesAllocated = 0;
          local_48.ptr = (uint8_t *)0x0;
          pbrt::NanoVDBBuffer::init(&local_48,(EVP_PKEY_CTX *)*puVar15);
          (__return_storage_ptr__->super_GridHandleBase)._vptr_GridHandleBase =
               (_func_int **)&PTR__GridHandle_0303bc58;
          pmVar7 = pstd::pmr::new_delete_resource();
          (__return_storage_ptr__->mBuffer).alloc.memoryResource = pmVar7;
          (__return_storage_ptr__->mBuffer).bytesAllocated = 0;
          (__return_storage_ptr__->mBuffer).ptr = (uint8_t *)0x0;
          pbrt::NanoVDBBuffer::operator=(&__return_storage_ptr__->mBuffer,&local_48);
          pbrt::NanoVDBBuffer::clear(&local_48);
          std::istream::seekg((long)is,(_Ios_Seekdir)lVar12);
          sVar1 = (__return_storage_ptr__->mBuffer).bytesAllocated;
          puVar2 = (__return_storage_ptr__->mBuffer).ptr;
          if (local_70.header.codec == ZIP) {
            std::istream::read((char *)is,(long)&local_90);
            pvVar8 = operator_new__(local_90);
            std::istream::read((char *)is,(long)pvVar8);
            local_78 = sVar1;
            iVar4 = uncompress(puVar2,&local_78,pvVar8,local_90);
            if (iVar4 != 0) {
              std::runtime_error::runtime_error
                        ((runtime_error *)&local_48,"Internal read error in ZIP");
              std::runtime_error::~runtime_error((runtime_error *)&local_48);
            }
            if (local_78 != sVar1) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar9,"UNZIP failed on byte size");
              __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            operator_delete__(pvVar8);
          }
          else {
            if (local_70.header.codec == BLOSC) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (prVar9,"BLOSC compression codec was disabled during build");
              goto LAB_0039e7be;
            }
            std::istream::read((char *)is,(long)puVar2);
          }
          if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar9,"Failed to read Tree from file");
LAB_0039e7be:
            __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_0039e732;
        }
        lVar12 = lVar12 + puVar15[1];
        _Var11 = (_Ios_Seekdir)lVar12;
        puVar15 = puVar15 + 0x16;
      } while (puVar15 != puVar3);
    }
    std::istream::seekg((long)is,_Var11);
    __buf = extraout_RDX;
  } while( true );
}

Assistant:

GridHandle<BufferT> readGrid(std::istream& is, const std::string& gridName, const BufferT& buffer)
{
    const auto key = stringHash(gridName);
    Segment    s;
    while (s.read(is)) {
        std::streamoff seek = 0;
        for (auto& m : s.meta) {
            if (m.nameKey == key && m.gridName == gridName) { // check for hask key collision
                GridHandle<BufferT> handle(BufferT::create(m.gridSize, &buffer));
                is.seekg(seek, std::ios_base::cur); // rewind
                Internal::read(is, handle, s.header.codec);
                return handle;// is converted to r-value and return value is move constructed.
            } else {
                seek += m.fileSize;
            }
        }
        is.seekg(seek, std::ios_base::cur); // skip forward from the current position
    }
    return GridHandle<BufferT>();// empty handle
}